

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

void __thiscall BoardView::LoadBoard(BoardView *this,BRDFileBase *file)

{
  bool bVar1;
  size_type sVar2;
  reference __src;
  pointer psVar3;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *this_00;
  element_type *peVar4;
  reference ppVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *this_02;
  long in_RSI;
  vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *in_RDI;
  float sy;
  float sx;
  float dy;
  float dx;
  ImVec2 view;
  pair<Point,_Point> *s;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_> *__range1_3;
  shared_ptr<Point> *pa;
  iterator __end1_2;
  iterator __begin1_2;
  SharedVector<Point> *__range1_2;
  int max_y;
  int min_y;
  int max_x;
  int min_x;
  shared_ptr<Component> *p;
  iterator __end1_1;
  iterator __begin1_1;
  SharedVector<Component> *__range1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  partnames;
  shared_ptr<Net> *n;
  iterator __end1;
  iterator __begin1;
  SharedVector<Net> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  netnames;
  BRDPin a;
  iterator __end2;
  iterator __begin2;
  vector<BRDPin,_std::allocator<BRDPin>_> *__range2;
  int margin;
  int maxy;
  int miny;
  int maxx;
  int minx;
  vector<BRDPin,_std::allocator<BRDPin>_> pins;
  BRDFileBase *in_stack_000003a8;
  BRDBoard *in_stack_000003b0;
  value_type *in_stack_fffffffffffffd68;
  pointer *__r;
  Searcher *in_stack_fffffffffffffd70;
  value_type *in_stack_fffffffffffffd78;
  BoardView *in_stack_fffffffffffffd80;
  float local_274;
  float local_270;
  float local_26c;
  vector<BRDPin,_std::allocator<BRDPin>_> *in_stack_fffffffffffffdb8;
  vector<BRDPin,_std::allocator<BRDPin>_> *in_stack_fffffffffffffdc0;
  vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *this_03;
  vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *in_stack_fffffffffffffe08;
  float local_1c0;
  float fStack_1bc;
  __normal_iterator<std::pair<Point,_Point>_*,_std::vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>_>
  local_1a8;
  size_type local_1a0;
  reference local_198;
  shared_ptr<Point> *local_190;
  __normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
  local_188;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *local_180;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  reference local_168;
  shared_ptr<Component> *local_160;
  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
  local_158;
  undefined8 local_150;
  reference local_130;
  shared_ptr<Net> *local_128;
  __normal_iterator<std::shared_ptr<Net>_*,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
  local_120;
  undefined8 local_118;
  BRDPoint local_c4;
  BRDPoint local_bc;
  BRDPoint local_b4;
  BRDPoint local_ac [2];
  BRDPoint local_98;
  int local_90;
  int local_8c;
  BRDPin *local_58;
  __normal_iterator<BRDPin_*,_std::vector<BRDPin,_std::allocator<BRDPin>_>_> local_50;
  undefined1 *local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined1 local_28 [24];
  long local_10;
  
  psVar3 = (in_RDI->super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_10 = in_RSI;
  if (psVar3 != (pointer)0x0) {
    (**(code **)&(((psVar3->super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 super_BoardElement).board_side)();
  }
  sVar2 = std::
          vector<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>::
          size((vector<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                *)(local_10 + 0x30));
  if (sVar2 < 3) {
    sVar2 = std::vector<BRDPoint,_std::allocator<BRDPoint>_>::size
                      ((vector<BRDPoint,_std::allocator<BRDPoint>_> *)(local_10 + 0x18));
    if (sVar2 < 3) {
      std::vector<BRDPin,_std::allocator<BRDPin>_>::vector
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      local_3c = 200;
      local_34 = 0x7fffffff;
      local_2c = 0x7fffffff;
      local_38 = -0x80000000;
      local_30 = -0x80000000;
      local_48 = local_28;
      local_50._M_current =
           (BRDPin *)
           std::vector<BRDPin,_std::allocator<BRDPin>_>::begin
                     ((vector<BRDPin,_std::allocator<BRDPin>_> *)in_stack_fffffffffffffd68);
      local_58 = (BRDPin *)
                 std::vector<BRDPin,_std::allocator<BRDPin>_>::end
                           ((vector<BRDPin,_std::allocator<BRDPin>_> *)in_stack_fffffffffffffd68);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<BRDPin_*,_std::vector<BRDPin,_std::allocator<BRDPin>_>_>
                            *)in_stack_fffffffffffffd70,
                           (__normal_iterator<BRDPin_*,_std::vector<BRDPin,_std::allocator<BRDPin>_>_>
                            *)in_stack_fffffffffffffd68);
        if (!bVar1) break;
        __src = __gnu_cxx::
                __normal_iterator<BRDPin_*,_std::vector<BRDPin,_std::allocator<BRDPin>_>_>::
                operator*(&local_50);
        memcpy(&local_90,__src,0x38);
        if (local_30 < local_90) {
          local_30 = local_90;
        }
        if (local_38 < local_8c) {
          local_38 = local_8c;
        }
        if (local_90 < local_2c) {
          local_2c = local_90;
        }
        if (local_8c < local_34) {
          local_34 = local_8c;
        }
        __gnu_cxx::__normal_iterator<BRDPin_*,_std::vector<BRDPin,_std::allocator<BRDPin>_>_>::
        operator++(&local_50);
      }
      local_30 = local_30 + local_3c;
      local_38 = local_38 + local_3c;
      local_2c = local_2c - local_3c;
      local_34 = local_34 - local_3c;
      in_stack_fffffffffffffe08 =
           (vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)(local_10 + 0x18)
      ;
      BRDPoint::BRDPoint(&local_98,local_2c,local_34);
      std::vector<BRDPoint,_std::allocator<BRDPoint>_>::push_back
                ((vector<BRDPoint,_std::allocator<BRDPoint>_> *)in_stack_fffffffffffffd70,
                 in_stack_fffffffffffffd68);
      BRDPoint::BRDPoint(local_ac,local_30,local_34);
      std::vector<BRDPoint,_std::allocator<BRDPoint>_>::push_back
                ((vector<BRDPoint,_std::allocator<BRDPoint>_> *)in_stack_fffffffffffffd70,
                 in_stack_fffffffffffffd68);
      BRDPoint::BRDPoint(&local_b4,local_30,local_38);
      std::vector<BRDPoint,_std::allocator<BRDPoint>_>::push_back
                ((vector<BRDPoint,_std::allocator<BRDPoint>_> *)in_stack_fffffffffffffd70,
                 in_stack_fffffffffffffd68);
      BRDPoint::BRDPoint(&local_bc,local_2c,local_38);
      std::vector<BRDPoint,_std::allocator<BRDPoint>_>::push_back
                ((vector<BRDPoint,_std::allocator<BRDPoint>_> *)in_stack_fffffffffffffd70,
                 in_stack_fffffffffffffd68);
      BRDPoint::BRDPoint(&local_c4,local_2c,local_34);
      std::vector<BRDPoint,_std::allocator<BRDPoint>_>::push_back
                ((vector<BRDPoint,_std::allocator<BRDPoint>_> *)in_stack_fffffffffffffd70,
                 in_stack_fffffffffffffd68);
      std::vector<BRDPin,_std::allocator<BRDPin>_>::~vector
                ((vector<BRDPin,_std::allocator<BRDPin>_> *)in_stack_fffffffffffffd80);
    }
  }
  psVar3 = (pointer)operator_new(0x88);
  BRDBoard::BRDBoard(in_stack_000003b0,in_stack_000003a8);
  (in_RDI->super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>)._M_impl
  .super__Vector_impl_data._M_finish = psVar3;
  (*(code *)(((((in_RDI->
                super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>).
                _M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->name)._M_string_length)
            ();
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::vector
            ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
             in_stack_fffffffffffffdc0,
             (vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
             in_stack_fffffffffffffdb8);
  Searcher::setParts(in_stack_fffffffffffffd70,(SharedVector<Component> *)in_stack_fffffffffffffd68)
  ;
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::~vector
            ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
             in_stack_fffffffffffffd80);
  this_03 = in_RDI + 0x865;
  (**(code **)&((((in_RDI->
                  super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish)->
                super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->name)();
  std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::vector
            (this_03,(vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
                     in_stack_fffffffffffffdb8);
  Searcher::setNets(in_stack_fffffffffffffd70,(SharedVector<Net> *)in_stack_fffffffffffffd68);
  std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::~vector
            ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
             in_stack_fffffffffffffd80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x11e094);
  local_118 = (**(code **)&((((in_RDI->
                              super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish)->
                            super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->name)();
  local_120._M_current =
       (shared_ptr<Net> *)
       std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::begin
                 ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
                  in_stack_fffffffffffffd68);
  local_128 = (shared_ptr<Net> *)
              std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::end
                        ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
                         in_stack_fffffffffffffd68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<Net>_*,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
                        *)in_stack_fffffffffffffd70,
                       (__normal_iterator<std::shared_ptr<Net>_*,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
                        *)in_stack_fffffffffffffd68);
    if (!bVar1) break;
    local_130 = __gnu_cxx::
                __normal_iterator<std::shared_ptr<Net>_*,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
                ::operator*(&local_120);
    std::__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Net,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x11e127);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Net>_*,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
    ::operator++(&local_120);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x11e1e8);
  local_150 = (*(code *)(((((in_RDI->
                            super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish)->
                          super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->name).
                        _M_string_length)();
  local_158._M_current =
       (shared_ptr<Component> *)
       std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::begin
                 ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                   *)in_stack_fffffffffffffd68);
  local_160 = (shared_ptr<Component> *)
              std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
              ::end((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                     *)in_stack_fffffffffffffd68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                        *)in_stack_fffffffffffffd70,
                       (__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                        *)in_stack_fffffffffffffd68);
    if (!bVar1) break;
    local_168 = __gnu_cxx::
                __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                ::operator*(&local_158);
    std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x11e278)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
    ::operator++(&local_158);
  }
  SpellCorrector::setDictionary
            ((SpellCorrector *)in_stack_fffffffffffffd70,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffd68);
  SpellCorrector::setDictionary
            ((SpellCorrector *)in_stack_fffffffffffffd70,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffd68);
  (**(code **)&((((in_RDI->
                  super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish)->
                super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->name)();
  std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::operator=
            (in_RDI,in_stack_fffffffffffffe08);
  local_16c = 0x7fffffff;
  local_170 = -0x80000000;
  local_174 = 0x7fffffff;
  local_178 = -0x80000000;
  this_00 = (vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
            (**(code **)((long)&(((((in_RDI->
                                    super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish)->
                                  super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->name
                                ).field_2 + 8))();
  local_180 = this_00;
  local_188._M_current =
       (shared_ptr<Point> *)
       std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::begin
                 ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *)
                  in_stack_fffffffffffffd68);
  local_190 = (shared_ptr<Point> *)
              std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::end
                        ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *
                         )in_stack_fffffffffffffd68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
                        *)in_stack_fffffffffffffd70,
                       (__normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
                        *)in_stack_fffffffffffffd68);
    if (!bVar1) break;
    local_198 = __gnu_cxx::
                __normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
                ::operator*(&local_188);
    peVar4 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x11e3f7);
    if (peVar4->x < (float)local_16c) {
      peVar4 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          0x11e416);
      local_16c = (int)peVar4->x;
    }
    peVar4 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x11e42e);
    if (peVar4->y < (float)local_174) {
      peVar4 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          0x11e44e);
      local_174 = (int)peVar4->y;
    }
    peVar4 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x11e467);
    if ((float)local_170 < peVar4->x) {
      peVar4 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          0x11e486);
      local_170 = (int)peVar4->x;
    }
    peVar4 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x11e49e);
    if ((float)local_178 < peVar4->y) {
      peVar4 = std::__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          0x11e4be);
      local_178 = (int)peVar4->y;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Point>_*,_std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>_>
    ::operator++(&local_188);
  }
  sVar2 = (**(code **)&((((in_RDI->
                          super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish)->
                        super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->is_ground)();
  local_1a0 = sVar2;
  local_1a8._M_current =
       (pair<Point,_Point> *)
       std::vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>::begin
                 ((vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_> *)
                  in_stack_fffffffffffffd68);
  std::vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>::end
            ((vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_> *)
             in_stack_fffffffffffffd68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::pair<Point,_Point>_*,_std::vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>_>
                        *)in_stack_fffffffffffffd70,
                       (__normal_iterator<std::pair<Point,_Point>_*,_std::vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>_>
                        *)in_stack_fffffffffffffd68);
    if (!bVar1) break;
    ppVar5 = __gnu_cxx::
             __normal_iterator<std::pair<Point,_Point>_*,_std::vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>_>
             ::operator*(&local_1a8);
    if ((ppVar5->first).x < (float)local_16c) {
      local_16c = (int)(ppVar5->first).x;
    }
    if ((ppVar5->second).x < (float)local_16c) {
      local_16c = (int)(ppVar5->second).x;
    }
    if ((ppVar5->first).y < (float)local_174) {
      local_174 = (int)(ppVar5->first).y;
    }
    if ((ppVar5->second).y < (float)local_174) {
      local_174 = (int)(ppVar5->second).y;
    }
    if ((float)local_170 < (ppVar5->first).x) {
      local_170 = (int)(ppVar5->first).x;
    }
    if ((float)local_170 < (ppVar5->second).x) {
      local_170 = (int)(ppVar5->second).x;
    }
    if ((float)local_178 < (ppVar5->first).y) {
      local_178 = (int)(ppVar5->first).y;
    }
    if ((float)local_178 < (ppVar5->second).y) {
      local_178 = (int)(ppVar5->second).y;
    }
    __gnu_cxx::
    __normal_iterator<std::pair<Point,_Point>_*,_std::vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>_>
    ::operator++(&local_1a8);
  }
  psVar3 = in_RDI[0x8ea].
           super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(float *)&in_RDI[0x8e8].
             super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>.
             _M_impl.super__Vector_impl_data._M_start = (float)(local_16c + local_170) / 2.0;
  *(float *)((long)&in_RDI[0x8e8].
                    super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 4) =
       (float)(local_174 + local_178) / 2.0;
  local_26c = (float)(local_170 - local_16c) * 1.1;
  local_270 = (float)(local_178 - local_174) * 1.1;
  if (local_26c <= 0.0) {
    local_26c = 1.0;
  }
  else {
    local_1c0 = SUB84(psVar3,0);
    local_26c = local_1c0 / local_26c;
  }
  if (local_270 <= 0.0) {
    local_270 = 1.0;
  }
  else {
    fStack_1bc = (float)((ulong)psVar3 >> 0x20);
    local_270 = fStack_1bc / local_270;
  }
  if (local_270 <= local_26c) {
    local_274 = local_270;
  }
  else {
    local_274 = local_26c;
  }
  *(float *)&in_RDI[0x8e8].
             super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>.
             _M_impl.super__Vector_impl_data._M_finish = local_274;
  *(float *)((long)&in_RDI[0x8e8].
                    super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + 4) = local_274;
  *(int *)&in_RDI[0x8e9].
           super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>._M_impl.
           super__Vector_impl_data._M_finish = local_170 - local_16c;
  *(int *)((long)&in_RDI[0x8e9].
                  super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish + 4) = local_178 - local_174;
  SetTarget(in_stack_fffffffffffffd80,(float)((ulong)in_stack_fffffffffffffd78 >> 0x20),
            SUB84(in_stack_fffffffffffffd78,0));
  this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(*(code *)(((((in_RDI->
                             super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish)->
                           super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->name).
                         _M_string_length)();
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::size
            ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
             this_01);
  std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::reserve
            ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)this_00,sVar2);
  __r = &in_RDI[0x8c5].
         super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  this_02 = (vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
            (*(code *)(((((in_RDI->
                          super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish)->
                        super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->name).
                      _M_string_length)();
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::size
            (this_02);
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::reserve
            (this_00,sVar2);
  std::shared_ptr<Pin>::shared_ptr((shared_ptr<Pin> *)this_02,__r);
  std::shared_ptr<Pin>::operator=((shared_ptr<Pin> *)this_02,(shared_ptr<Pin> *)__r);
  std::shared_ptr<Pin>::~shared_ptr((shared_ptr<Pin> *)0x11e989);
  *(undefined1 *)
   &in_RDI[0x8f2].super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>.
    _M_impl.super__Vector_impl_data._M_start = 1;
  *(undefined1 *)
   ((long)&in_RDI[0x8f1].
           super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 6) = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_01);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_01);
  return;
}

Assistant:

void BoardView::LoadBoard(BRDFileBase *file) {
	delete m_board;

	// Check board outline (format) point count.
	//		If we don't have an outline, generate one
	//
	if (file->outline_segments.size() < 3 && file->format.size() < 3) {
		auto pins = file->pins;
		int minx, maxx, miny, maxy;
		int margin = 200; // #define or leave this be? Rather arbritary.

		minx = miny = INT_MAX;
		maxx = maxy = INT_MIN;

		for (auto a : pins) {
			if (a.pos.x > maxx) maxx = a.pos.x;
			if (a.pos.y > maxy) maxy = a.pos.y;
			if (a.pos.x < minx) minx = a.pos.x;
			if (a.pos.y < miny) miny = a.pos.y;
		}

		maxx += margin;
		maxy += margin;
		minx -= margin;
		miny -= margin;

		file->format.push_back({minx, miny});
		file->format.push_back({maxx, miny});
		file->format.push_back({maxx, maxy});
		file->format.push_back({minx, maxy});
		file->format.push_back({minx, miny});
	}

	m_board = new BRDBoard(file);
	searcher.setParts(m_board->Components());
	searcher.setNets(m_board->Nets());

	std::vector<std::string> netnames;
	for (auto &n : m_board->Nets()) netnames.push_back(n->name);
	std::vector<std::string> partnames;
	for (auto &p : m_board->Components()) netnames.push_back(p->name);

	scnets.setDictionary(netnames);
	scparts.setDictionary(partnames);

	m_nets = m_board->Nets();

	int min_x = INT_MAX, max_x = INT_MIN, min_y = INT_MAX, max_y = INT_MIN;
	for (auto &pa : m_board->OutlinePoints()) {
		if (pa->x < min_x) min_x = pa->x;
		if (pa->y < min_y) min_y = pa->y;
		if (pa->x > max_x) max_x = pa->x;
		if (pa->y > max_y) max_y = pa->y;
	}
	for (auto &s: m_board->OutlineSegments()) {
		if (s.first.x < min_x) min_x = s.first.x;
		if (s.second.x < min_x) min_x = s.second.x;
		if (s.first.y < min_y) min_y = s.first.y;
		if (s.second.y < min_y) min_y = s.second.y;
		if (s.first.x > max_x) max_x = s.first.x;
		if (s.second.x > max_x) max_x = s.second.x;
		if (s.first.y > max_y) max_y = s.first.y;
		if (s.second.y > max_y) max_y = s.second.y;
	}

	// ImVec2 view = ImGui::GetIO().DisplaySize;
	ImVec2 view = m_board_surface;

	m_mx = (float)(min_x + max_x) / 2.0f;
	m_my = (float)(min_y + max_y) / 2.0f;

	float dx = 1.1f * (max_x - min_x);
	float dy = 1.1f * (max_y - min_y);
	float sx = dx > 0 ? view.x / dx : 1.0f;
	float sy = dy > 0 ? view.y / dy : 1.0f;

	m_scale_floor = m_scale = sx < sy ? sx : sy;
	m_boardWidth            = max_x - min_x;
	m_boardHeight           = max_y - min_y;
	SetTarget(m_mx, m_my);

	m_pinHighlighted.reserve(m_board->Components().size());
	m_partHighlighted.reserve(m_board->Components().size());
	m_pinSelected = nullptr;

	m_firstFrame  = true;
	m_needsRedraw = true;
}